

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<double>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
               (ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                *renderer,ImDrawList *DrawList,ImRect *cull_rect)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int prim;
  uint uVar6;
  ImVec2 uv;
  uint local_44;
  ImVec2 local_40;
  int local_34;
  
  local_44 = renderer->Prims;
  local_40 = DrawList->_Data->TexUvWhitePixel;
  if (local_44 != 0) {
    prim = 0;
    uVar4 = 0;
    do {
      uVar5 = 0xffff - DrawList->_VtxCurrentIdx;
      uVar6 = uVar5 / 5;
      if (local_44 < uVar5 / 5) {
        uVar6 = local_44;
      }
      uVar3 = 0x40;
      if (local_44 < 0x40) {
        uVar3 = local_44;
      }
      if (uVar5 / 5 < uVar3) {
        if (uVar4 != 0) {
          ImDrawList::PrimUnreserve(DrawList,uVar4 * 6,uVar4 * 5);
        }
        uVar4 = 0x3333;
        uVar6 = 0x3333;
        if (local_44 < 0x3333) {
          uVar4 = local_44;
          uVar6 = local_44;
        }
LAB_002b77a7:
        ImDrawList::PrimReserve(DrawList,uVar4 * 6,uVar4 * 5);
        local_44 = local_44 - uVar6;
        uVar4 = 0;
LAB_002b77c8:
        local_34 = prim + uVar6;
        do {
          bVar2 = ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                  ::operator()(renderer,DrawList,cull_rect,&local_40,prim);
          uVar4 = uVar4 + !bVar2;
          prim = prim + 1;
          uVar6 = uVar6 - 1;
          iVar1 = local_34;
        } while (uVar6 != 0);
      }
      else {
        uVar3 = uVar4 - uVar6;
        if (uVar4 < uVar6) {
          uVar4 = uVar6 - uVar4;
          goto LAB_002b77a7;
        }
        local_44 = local_44 - uVar6;
        uVar4 = uVar3;
        iVar1 = prim;
        if (4 < uVar5) goto LAB_002b77c8;
      }
      prim = iVar1;
    } while (local_44 != 0);
    if (uVar4 != 0) {
      ImDrawList::PrimUnreserve(DrawList,uVar4 * 6,uVar4 * 5);
    }
  }
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}